

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

void __thiscall
PlanningUnitMADPDiscrete::DeInitializeActionObservationHistories(PlanningUnitMADPDiscrete *this)

{
  pointer ppAVar1;
  pointer puVar2;
  pointer ppAVar3;
  
  ppAVar1 = (this->_m_actionObservationHistoryTreeRootPointers).
            super__Vector_base<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar3 = (this->_m_actionObservationHistoryTreeRootPointers).
                 super__Vector_base<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppAVar3 != ppAVar1;
      ppAVar3 = ppAVar3 + 1) {
    if (*ppAVar3 != (ActionObservationHistoryTree *)0x0) {
      (*((*ppAVar3)->super_TreeNode<ActionObservationHistory>)._vptr_TreeNode[1])();
    }
  }
  ppAVar3 = (this->_m_actionObservationHistoryTreeRootPointers).
            super__Vector_base<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_actionObservationHistoryTreeRootPointers).
      super__Vector_base<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppAVar3) {
    (this->_m_actionObservationHistoryTreeRootPointers).
    super__Vector_base<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppAVar3;
  }
  std::
  vector<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>,_std::allocator<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>_>
  ::_M_erase_at_end(&this->_m_actionObservationHistoryTreeVectors,
                    (this->_m_actionObservationHistoryTreeVectors).
                    super__Vector_base<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>,_std::allocator<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  puVar2 = (this->_m_nrActionObservationHistories).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_m_nrActionObservationHistories).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->_m_nrActionObservationHistories).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_erase_at_end(&this->_m_nrActionObservationHistoriesT,
                    (this->_m_nrActionObservationHistoriesT).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::_M_erase_at_end(&this->_m_firstAOHIforT,
                    (this->_m_firstAOHIforT).
                    super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void PlanningUnitMADPDiscrete::DeInitializeActionObservationHistories()
{
    vector<ActionObservationHistoryTree *>::iterator it = 
    _m_actionObservationHistoryTreeRootPointers.begin();
    vector<ActionObservationHistoryTree *>::iterator last = 
    _m_actionObservationHistoryTreeRootPointers.end();
    while(it != last)
    {
        if( *it != 0 ) 
            delete *it;    //this recursively deletes the 
                //whole ActionObservationHistoryTree
        it++;
    }
    _m_actionObservationHistoryTreeRootPointers.clear();
    _m_actionObservationHistoryTreeVectors.clear();
    _m_nrActionObservationHistories.clear();
    _m_nrActionObservationHistoriesT.clear(); 
    _m_firstAOHIforT.clear();
}